

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

void btree_update_meta(btree *btree,btree_meta *meta)

{
  ushort uVar1;
  int iVar2;
  voidref addr_00;
  bnode *expression;
  size_t sVar3;
  ushort *in_RSI;
  btree *in_RDI;
  bnode *node;
  metasize_t old_metasize;
  metasize_t _metasize;
  metasize_t metasize;
  void *ptr;
  void *addr;
  uint64_t in_stack_ffffffffffffffb0;
  bnode *__dest;
  uint64_t in_stack_ffffffffffffffb8;
  void *pvVar4;
  undefined8 in_stack_ffffffffffffffc0;
  void *__dest_00;
  char *in_stack_ffffffffffffffc8;
  bnode *pbVar5;
  ushort local_26;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_26 = 0xffff;
  addr_00 = (*in_RDI->blk_ops->blk_read)(in_RDI->blk_handle,in_RDI->root_bid);
  expression = _fetch_bnode(in_RDI,addr_00,in_RDI->height);
  __dest = expression + 1;
  if ((expression->flag & 2) != 0) {
    local_26 = __dest->kvsize >> 8 | __dest->kvsize << 8;
  }
  if (in_RSI == (ushort *)0x0) {
    if ((expression->flag & 2) != 0) {
      pvVar4 = (expression->field_4).data;
      sVar3 = (*in_RDI->kv_ops->get_data_size)(expression,(void *)0x0,(void *)0x0,(void *)0x0,0);
      memmove(__dest,pvVar4,sVar3);
      (expression->field_4).data =
           (void *)((long)(expression->field_4).data - ((ulong)local_26 + 0x11 & 0xfffffffffffffff0)
                   );
      expression->flag = expression->flag & 0xfffd;
    }
  }
  else {
    uVar1 = *in_RSI;
    pbVar5 = expression;
    if (local_26 < uVar1) {
      fdb_assert_die((char *)expression,in_stack_ffffffffffffffc8,iVar2,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0);
    }
    if (*in_RSI == 0) {
      pbVar5->flag = pbVar5->flag & 0xfffd;
    }
    else {
      __dest->kvsize = uVar1 >> 8 | uVar1 << 8;
      memcpy(&expression[1].flag,*(void **)(in_RSI + 4),(ulong)uVar1);
      pbVar5->flag = pbVar5->flag | 2;
    }
    if (((ulong)uVar1 + 0x11 & 0xfffffffffffffff0) - 2 <
        ((ulong)local_26 + 0x11 & 0xfffffffffffffff0) - 2) {
      __dest_00 = (void *)((long)&__dest->kvsize + ((ulong)uVar1 + 0x11 & 0xfffffffffffffff0));
      pvVar4 = (pbVar5->field_4).data;
      sVar3 = (*in_RDI->kv_ops->get_data_size)(pbVar5,(void *)0x0,(void *)0x0,(void *)0x0,0);
      memmove(__dest_00,pvVar4,sVar3);
      (pbVar5->field_4).data =
           (void *)((long)(pbVar5->field_4).data -
                   ((((ulong)local_26 + 0x11 & 0xfffffffffffffff0) - 2) -
                   (((ulong)uVar1 + 0x11 & 0xfffffffffffffff0) - 2)));
    }
  }
  iVar2 = (*in_RDI->blk_ops->blk_is_writable)(in_RDI->blk_handle,in_RDI->root_bid);
  if (iVar2 == 0) {
    (*in_RDI->blk_ops->blk_move)(in_RDI->blk_handle,in_RDI->root_bid,&in_RDI->root_bid);
  }
  else {
    (*in_RDI->blk_ops->blk_set_dirty)(in_RDI->blk_handle,in_RDI->root_bid);
  }
  return;
}

Assistant:

void btree_update_meta(struct btree *btree, struct btree_meta *meta)
{
    void *addr;
    void *ptr;
    metasize_t metasize, _metasize;
    metasize_t old_metasize = (metasize_t)(-1);
    struct bnode *node;

    // read root node
    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    node = _fetch_bnode(btree, addr, btree->height);

    ptr = ((uint8_t *)node) + sizeof(struct bnode);

    if (node->flag & BNODE_MASK_METADATA) {
        memcpy(&old_metasize, ptr, sizeof(metasize_t));
        old_metasize = _endian_decode(old_metasize);
    }

    if (meta) {
        metasize = meta->size;

        // new meta size cannot be larger than old meta size
        fdb_assert(metasize <= old_metasize, metasize, old_metasize);
        (void)metasize;

        // overwrite
        if (meta->size > 0) {
            _metasize = _endian_encode(metasize);
            memcpy(ptr, &_metasize, sizeof(metasize_t));
            memcpy((uint8_t *)ptr + sizeof(metasize_t), meta->data, metasize);
            node->flag |= BNODE_MASK_METADATA;
        }else{
            // clear the flag
            node->flag &= ~BNODE_MASK_METADATA;
        }
        // move kv-pairs (only if meta size is changed)
        if (_metasize_align(metasize) < _metasize_align(old_metasize)){
            memmove(
                (uint8_t *)ptr + sizeof(metasize_t) + _metasize_align(metasize),
                node->data,
                btree->kv_ops->get_data_size(node, NULL, NULL, NULL, 0));
            node->data = (uint8_t *)node->data - (_metasize_align(old_metasize) -
                         _metasize_align(metasize));
        }

    }else {
        if (node->flag & BNODE_MASK_METADATA) {
            // existing metadata is removed
            memmove(ptr, node->data, btree->kv_ops->get_data_size(node,
                                                    NULL, NULL, NULL, 0));
            node->data = (uint8_t *)node->data - (_metasize_align(old_metasize) +
                         sizeof(metasize_t));
            // clear the flag
            node->flag &= ~BNODE_MASK_METADATA;
        }
    }

    if (!btree->blk_ops->blk_is_writable(btree->blk_handle, btree->root_bid)) {
        // already flushed block -> cannot overwrite, we have to move to new block
        btree->blk_ops->blk_move(btree->blk_handle, btree->root_bid,
                                &btree->root_bid);
    }else{
        btree->blk_ops->blk_set_dirty(btree->blk_handle, btree->root_bid);
    }
}